

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_slot_allocator_alloc(ma_slot_allocator *pAllocator,ma_uint64 *pSlot)

{
  ma_result mVar1;
  bool bVar2;
  ma_uint32 mVar3;
  ulong uVar4;
  ma_uint32 i;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  mVar1 = MA_INVALID_ARGS;
  if (pSlot != (ma_uint64 *)0x0 && pAllocator != (ma_slot_allocator *)0x0) {
    bVar7 = true;
    do {
      bVar2 = bVar7;
      uVar6 = pAllocator->capacity;
      if ((uVar6 & 0x1f) != 0 || uVar6 >> 5 != 0) {
        uVar4 = 0;
        do {
          while (uVar6 = pAllocator->pGroups[uVar4].bitfield, uVar6 != 0xffffffff) {
            uVar5 = 0;
            do {
              if ((uVar6 >> (uVar5 & 0x1f) & 1) == 0) goto LAB_001354d4;
              uVar5 = uVar5 + 1;
            } while (uVar5 != 0x20);
            uVar5 = 0x20;
LAB_001354d4:
            LOCK();
            bVar7 = uVar6 == pAllocator->pGroups[uVar4].bitfield;
            if (bVar7) {
              pAllocator->pGroups[uVar4].bitfield = uVar6 | 1 << (uVar5 & 0x1f);
            }
            UNLOCK();
            if (bVar7) {
              LOCK();
              pAllocator->count = pAllocator->count + 1;
              UNLOCK();
              uVar5 = uVar5 + (int)uVar4 * 0x20;
              if (pAllocator->capacity <= uVar5) {
                return MA_OUT_OF_MEMORY;
              }
              mVar3 = pAllocator->pSlots[uVar5] + 1;
              pAllocator->pSlots[uVar5] = mVar3;
              *pSlot = CONCAT44(mVar3,uVar5);
              return MA_SUCCESS;
            }
          }
          uVar4 = uVar4 + 1;
          uVar6 = pAllocator->capacity;
        } while (uVar4 < ((uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0));
      }
      mVar1 = MA_OUT_OF_MEMORY;
    } while ((pAllocator->count < uVar6) && (bVar7 = false, bVar2));
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_slot_allocator_alloc(ma_slot_allocator* pAllocator, ma_uint64* pSlot)
{
    ma_uint32 iAttempt;
    const ma_uint32 maxAttempts = 2;    /* The number of iterations to perform until returning MA_OUT_OF_MEMORY if no slots can be found. */

    if (pAllocator == NULL || pSlot == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iAttempt = 0; iAttempt < maxAttempts; iAttempt += 1) {
        /* We need to acquire a suitable bitfield first. This is a bitfield that's got an available slot within it. */
        ma_uint32 iGroup;
        for (iGroup = 0; iGroup < ma_slot_allocator_group_capacity(pAllocator); iGroup += 1) {
            /* CAS */
            for (;;) {
                ma_uint32 oldBitfield;
                ma_uint32 newBitfield;
                ma_uint32 bitOffset;

                oldBitfield = ma_atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */

                /* Fast check to see if anything is available. */
                if (oldBitfield == 0xFFFFFFFF) {
                    break;  /* No available bits in this bitfield. */
                }

                bitOffset = ma_ffs_32(~oldBitfield);
                MA_ASSERT(bitOffset < 32);

                newBitfield = oldBitfield | (1 << bitOffset);

                if (ma_atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
                    ma_uint32 slotIndex;

                    /* Increment the counter as soon as possible to have other threads report out-of-memory sooner than later. */
                    ma_atomic_fetch_add_32(&pAllocator->count, 1);

                    /* The slot index is required for constructing the output value. */
                    slotIndex = (iGroup << 5) + bitOffset;  /* iGroup << 5 = iGroup * 32 */
                    if (slotIndex >= pAllocator->capacity) {
                        return MA_OUT_OF_MEMORY;
                    }

                    /* Increment the reference count before constructing the output value. */
                    pAllocator->pSlots[slotIndex] += 1;

                    /* Construct the output value. */
                    *pSlot = (((ma_uint64)pAllocator->pSlots[slotIndex] << 32) | slotIndex);

                    return MA_SUCCESS;
                }
            }
        }

        /* We weren't able to find a slot. If it's because we've reached our capacity we need to return MA_OUT_OF_MEMORY. Otherwise we need to do another iteration and try again. */
        if (pAllocator->count < pAllocator->capacity) {
            ma_yield();
        } else {
            return MA_OUT_OF_MEMORY;
        }
    }

    /* We couldn't find a slot within the maximum number of attempts. */
    return MA_OUT_OF_MEMORY;
}